

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::OP_InitLetProperty(Var obj,PropertyId propertyId,Var newValue)

{
  Type *pTVar1;
  RecyclableObject *pRVar2;
  
  pRVar2 = VarTo<Js::RecyclableObject>(obj);
  pTVar1 = (pRVar2->type).ptr;
  (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x1e])(pRVar2,(ulong)(uint)propertyId,newValue,
            (ulong)((uint)((pTVar1->typeId & ~TypeIds_Null) == TypeIds_GlobalObject) << 4 | 0x47),0,
            (ulong)(((((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                         scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                     undeclBlockVarSentinel).ptr == (UndeclaredBlockVariable *)newValue | 8) << 4),
            0xf);
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitLetProperty(Var obj, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_InitLetFld);
        RecyclableObject* instance = VarTo<RecyclableObject>(obj);

        PropertyOperationFlags flags = instance->GetScriptContext()->IsUndeclBlockVar(newValue) ? PropertyOperation_SpecialValue : PropertyOperation_None;
        PropertyAttributes attributes = PropertyLetDefaults;

        if (VarIs<RootObjectBase>(instance))
        {
            attributes |= PropertyLetConstGlobal;
        }

        instance->SetPropertyWithAttributes(propertyId, newValue, attributes, NULL, (PropertyOperationFlags)(flags | PropertyOperation_AllowUndecl));

        return TRUE;
        JIT_HELPER_END(Op_InitLetFld);
    }